

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::PlotEx(ImGuiPlotType plot_type,char *label,_func_float_void_ptr_int *values_getter,
                  void *data,int values_count,int values_offset,char *overlay_text,float scale_min,
                  float scale_max,ImVec2 graph_size)

{
  ImU32 IVar1;
  ImVec2 p_max;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImU32 IVar4;
  ImU32 IVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  ImVec2 IVar13;
  ImVec2 pos;
  float fVar14;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float local_108;
  ImVec2 local_e8;
  int local_dc;
  undefined1 local_d8 [8];
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  ImGuiWindow *local_c8;
  ImVec2 pos0;
  float local_b8;
  ImRect inner_bb;
  ImRect frame_bb;
  ImRect total_bb;
  
  pIVar2 = GImGui;
  local_c8 = GImGui->CurrentWindow;
  local_c8->WriteAccessed = true;
  if (local_c8->SkipItems == false) {
    uStack_d0 = in_XMM2_Dc;
    local_d8 = (undefined1  [8])graph_size;
    uStack_cc = in_XMM2_Dd;
    IVar13 = CalcTextSize(label,(char *)0x0,true,-1.0);
    fVar11 = (float)local_d8._0_4_;
    if (((float)local_d8._0_4_ == 0.0) && (!NAN((float)local_d8._0_4_))) {
      fVar11 = CalcItemWidth();
    }
    fVar20 = IVar13.x;
    if (((float)local_d8._4_4_ != 0.0) || (NAN((float)local_d8._4_4_))) {
      fVar15 = (pIVar2->Style).FramePadding.y;
    }
    else {
      fVar15 = (pIVar2->Style).FramePadding.y;
      local_d8._4_4_ = fVar15 + fVar15 + IVar13.y;
    }
    frame_bb.Min.x = (local_c8->DC).CursorPos.x;
    frame_bb.Min.y = (local_c8->DC).CursorPos.y;
    local_d8._0_4_ = fVar11;
    frame_bb.Max.x = fVar11 + frame_bb.Min.x;
    frame_bb.Max.y = (float)local_d8._4_4_ + frame_bb.Min.y;
    fVar11 = (pIVar2->Style).FramePadding.x;
    inner_bb.Min.x = fVar11 + frame_bb.Min.x;
    inner_bb.Min.y = frame_bb.Min.y + fVar15;
    inner_bb.Max.y = frame_bb.Max.y - fVar15;
    inner_bb.Max.x = frame_bb.Max.x - fVar11;
    fVar11 = 0.0;
    if (0.0 < fVar20) {
      fVar11 = (pIVar2->Style).ItemInnerSpacing.x + fVar20;
    }
    total_bb.Max.x = frame_bb.Max.x + fVar11;
    total_bb.Max.y = frame_bb.Max.y + 0.0;
    total_bb.Min.x = frame_bb.Min.x;
    total_bb.Min.y = frame_bb.Min.y;
    ItemSize(&total_bb,fVar15);
    bVar3 = ItemAdd(&total_bb,0,&frame_bb);
    if (bVar3) {
      iVar9 = 0;
      bVar3 = ItemHoverable(&inner_bb,0);
      if (((scale_min == 3.4028235e+38) && (!NAN(scale_min))) ||
         ((local_b8 = scale_min, local_108 = scale_max, scale_max == 3.4028235e+38 &&
          (!NAN(scale_max))))) {
        iVar6 = 0;
        if (0 < values_count) {
          iVar6 = values_count;
        }
        fVar11 = 3.4028235e+38;
        fVar15 = -3.4028235e+38;
        for (; iVar6 != iVar9; iVar9 = iVar9 + 1) {
          fVar12 = (*values_getter)(data,iVar9);
          if (fVar12 <= fVar11) {
            fVar11 = fVar12;
          }
          fVar15 = (float)(-(uint)(fVar12 <= fVar15) & (uint)fVar15 |
                          ~-(uint)(fVar12 <= fVar15) & (uint)fVar12);
        }
        local_b8 = (float)(~-(uint)(scale_min == 3.4028235e+38) & (uint)scale_min |
                          (uint)fVar11 & -(uint)(scale_min == 3.4028235e+38));
        local_108 = (float)(~-(uint)(scale_max == 3.4028235e+38) & (uint)scale_max |
                           (uint)fVar15 & -(uint)(scale_max == 3.4028235e+38));
      }
      IVar13.y = frame_bb.Min.y;
      IVar13.x = frame_bb.Min.x;
      p_max.y = frame_bb.Max.y;
      p_max.x = frame_bb.Max.x;
      IVar4 = GetColorU32(7,1.0);
      RenderFrame(IVar13,p_max,IVar4,true,(pIVar2->Style).FrameRounding);
      local_dc = values_count;
      if (0 < values_count) {
        iVar9 = (int)(float)local_d8._0_4_;
        if (values_count <= (int)(float)local_d8._0_4_) {
          iVar9 = values_count;
        }
        iVar9 = iVar9 - (uint)(plot_type == ImGuiPlotType_Lines);
        iVar6 = values_count - (uint)(plot_type == ImGuiPlotType_Lines);
        if (bVar3) {
          fVar15 = ((pIVar2->IO).MousePos.x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x);
          fVar11 = 0.9999;
          if (fVar15 <= 0.9999) {
            fVar11 = fVar15;
          }
          uVar10 = (uint)((float)iVar6 * (float)(~-(uint)(fVar15 < 0.0) & (uint)fVar11));
          fVar11 = (*values_getter)(data,(int)(uVar10 + values_offset) % values_count);
          local_d8._0_4_ = fVar11;
          (*values_getter)(data,(int)(uVar10 + values_offset + 1) % values_count);
          if (plot_type == ImGuiPlotType_Lines) {
            SetTooltip("%d: %8.4g\n%d: %8.4g",(ulong)uVar10,(ulong)(uVar10 + 1));
          }
          else if (plot_type == ImGuiPlotType_Histogram) {
            SetTooltip("%d: %8.4g",(double)(float)local_d8._0_4_,(ulong)uVar10);
          }
        }
        else {
          uVar10 = 0xffffffff;
        }
        _local_d8 = ZEXT416(~-(uint)(local_b8 == local_108) & (uint)(1.0 / (local_108 - local_b8)));
        fVar11 = (*values_getter)(data,values_offset % values_count);
        fVar15 = (fVar11 - local_b8) * (float)local_d8._0_4_;
        fVar11 = 1.0;
        if (fVar15 <= 1.0) {
          fVar11 = fVar15;
        }
        if (0.0 <= local_108 * local_b8) {
          fVar12 = (float)(~-(uint)(local_b8 < 0.0) & 0x3f800000);
        }
        else {
          fVar12 = -local_b8 * (float)local_d8._0_4_;
        }
        IVar4 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x26,1.0);
        IVar5 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x27,1.0);
        iVar7 = 0;
        if (0 < iVar9) {
          iVar7 = iVar9;
        }
        fVar17 = 0.0;
        fVar11 = (float)(-(uint)(fVar15 < 0.0) & 0x3f800000 |
                        ~-(uint)(fVar15 < 0.0) & (uint)(1.0 - fVar11));
        while (bVar3 = iVar7 != 0, iVar7 = iVar7 + -1, bVar3) {
          uVar8 = (uint)(fVar17 * (float)iVar6 + 0.5);
          fVar15 = (*values_getter)(data,(int)(values_offset + 1 + uVar8) % local_dc);
          fVar18 = 1.0 / (float)iVar9 + fVar17;
          fVar19 = (fVar15 - local_b8) * (float)local_d8._0_4_;
          fVar15 = 1.0;
          if (fVar19 <= 1.0) {
            fVar15 = fVar19;
          }
          fVar15 = (float)(-(uint)(fVar19 < 0.0) & 0x3f800000 |
                          ~-(uint)(fVar19 < 0.0) & (uint)(1.0 - fVar15));
          fVar16 = inner_bb.Min.x;
          local_e8.y = inner_bb.Min.y;
          fVar19 = inner_bb.Max.x - fVar16;
          fVar14 = inner_bb.Max.y - local_e8.y;
          fVar21 = fVar17 * fVar19 + fVar16;
          pos0.y = fVar11 * fVar14 + local_e8.y;
          pos0.x = fVar21;
          fVar16 = fVar19 * fVar18 + fVar16;
          fVar17 = fVar18;
          fVar11 = fVar15;
          if (plot_type == ImGuiPlotType_Lines) {
            local_e8.y = fVar14 * fVar15 + local_e8.y;
            local_e8.x = fVar16;
            IVar1 = IVar4;
            if (uVar10 == uVar8) {
              IVar1 = IVar5;
            }
            ImDrawList::AddLine(local_c8->DrawList,&pos0,&local_e8,IVar1,1.0);
          }
          else {
            local_e8.y = fVar14 * fVar12 + local_e8.y;
            local_e8.x = fVar16;
            if (plot_type == ImGuiPlotType_Histogram) {
              if (fVar21 + 2.0 <= fVar16) {
                local_e8.x = fVar16 + -1.0;
              }
              IVar1 = IVar4;
              if (uVar10 == uVar8) {
                IVar1 = IVar5;
              }
              ImDrawList::AddRectFilled(local_c8->DrawList,&pos0,&local_e8,IVar1,0.0,0xf);
            }
          }
        }
      }
      if (overlay_text != (char *)0x0) {
        pos0.y = frame_bb.Min.y + (pIVar2->Style).FramePadding.y;
        pos0.x = frame_bb.Min.x;
        local_e8.x = 0.5;
        local_e8.y = 0.0;
        RenderTextClipped(&pos0,&frame_bb.Max,overlay_text,(char *)0x0,(ImVec2 *)0x0,&local_e8,
                          (ImRect *)0x0);
      }
      if (0.0 < fVar20) {
        pos.x = frame_bb.Max.x + (pIVar2->Style).ItemInnerSpacing.x;
        pos.y = inner_bb.Min.y;
        RenderText(pos,label,(char *)0x0,true);
      }
    }
  }
  return;
}

Assistant:

void ImGui::PlotEx(ImGuiPlotType plot_type, const char* label, float (*values_getter)(void* data, int idx), void* data, int values_count, int values_offset, const char* overlay_text, float scale_min, float scale_max, ImVec2 graph_size)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (graph_size.x == 0.0f)
        graph_size.x = CalcItemWidth();
    if (graph_size.y == 0.0f)
        graph_size.y = label_size.y + (style.FramePadding.y * 2);

    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(graph_size.x, graph_size.y));
    const ImRect inner_bb(frame_bb.Min + style.FramePadding, frame_bb.Max - style.FramePadding);
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0, &frame_bb))
        return;
    const bool hovered = ItemHoverable(inner_bb, 0);

    // Determine scale from values if not specified
    if (scale_min == FLT_MAX || scale_max == FLT_MAX)
    {
        float v_min = FLT_MAX;
        float v_max = -FLT_MAX;
        for (int i = 0; i < values_count; i++)
        {
            const float v = values_getter(data, i);
            v_min = ImMin(v_min, v);
            v_max = ImMax(v_max, v);
        }
        if (scale_min == FLT_MAX)
            scale_min = v_min;
        if (scale_max == FLT_MAX)
            scale_max = v_max;
    }

    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    if (values_count > 0)
    {
        int res_w = ImMin((int)graph_size.x, values_count) + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);
        int item_count = values_count + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);

        // Tooltip on hover
        int v_hovered = -1;
        if (hovered)
        {
            const float t = ImClamp((g.IO.MousePos.x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x), 0.0f, 0.9999f);
            const int v_idx = (int)(t * item_count);
            IM_ASSERT(v_idx >= 0 && v_idx < values_count);

            const float v0 = values_getter(data, (v_idx + values_offset) % values_count);
            const float v1 = values_getter(data, (v_idx + 1 + values_offset) % values_count);
            if (plot_type == ImGuiPlotType_Lines)
                SetTooltip("%d: %8.4g\n%d: %8.4g", v_idx, v0, v_idx+1, v1);
            else if (plot_type == ImGuiPlotType_Histogram)
                SetTooltip("%d: %8.4g", v_idx, v0);
            v_hovered = v_idx;
        }

        const float t_step = 1.0f / (float)res_w;
        const float inv_scale = (scale_min == scale_max) ? 0.0f : (1.0f / (scale_max - scale_min));

        float v0 = values_getter(data, (0 + values_offset) % values_count);
        float t0 = 0.0f;
        ImVec2 tp0 = ImVec2( t0, 1.0f - ImSaturate((v0 - scale_min) * inv_scale) );                       // Point in the normalized space of our target rectangle
        float histogram_zero_line_t = (scale_min * scale_max < 0.0f) ? (-scale_min * inv_scale) : (scale_min < 0.0f ? 0.0f : 1.0f);   // Where does the zero line stands

        const ImU32 col_base = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLines : ImGuiCol_PlotHistogram);
        const ImU32 col_hovered = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLinesHovered : ImGuiCol_PlotHistogramHovered);

        for (int n = 0; n < res_w; n++)
        {
            const float t1 = t0 + t_step;
            const int v1_idx = (int)(t0 * item_count + 0.5f);
            IM_ASSERT(v1_idx >= 0 && v1_idx < values_count);
            const float v1 = values_getter(data, (v1_idx + values_offset + 1) % values_count);
            const ImVec2 tp1 = ImVec2( t1, 1.0f - ImSaturate((v1 - scale_min) * inv_scale) );

            // NB: Draw calls are merged together by the DrawList system. Still, we should render our batch are lower level to save a bit of CPU.
            ImVec2 pos0 = ImLerp(inner_bb.Min, inner_bb.Max, tp0);
            ImVec2 pos1 = ImLerp(inner_bb.Min, inner_bb.Max, (plot_type == ImGuiPlotType_Lines) ? tp1 : ImVec2(tp1.x, histogram_zero_line_t));
            if (plot_type == ImGuiPlotType_Lines)
            {
                window->DrawList->AddLine(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
            }
            else if (plot_type == ImGuiPlotType_Histogram)
            {
                if (pos1.x >= pos0.x + 2.0f)
                    pos1.x -= 1.0f;
                window->DrawList->AddRectFilled(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
            }

            t0 = t1;
            tp0 = tp1;
        }
    }

    // Text overlay
    if (overlay_text)
        RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, overlay_text, NULL, NULL, ImVec2(0.5f,0.0f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, inner_bb.Min.y), label);
}